

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void anova_list(reg_object *list,int N)

{
  int local_18;
  int i;
  int N_local;
  reg_object *list_local;
  
  printf("\n");
  printf("ANOVA Multiple Models : \n");
  printf("%-10s%-25s%-20s%-20s%-20s \n","Model","Res.Df","RSS","Df","Sum of Sq");
  printf("%-10d%-25d%-20lf \n",(*list)->RSS,0,(ulong)(uint)(*list)->df_RSS);
  for (local_18 = 1; local_18 < N; local_18 = local_18 + 1) {
    printf("%-10d%-25d%-20lf%-20d%-20lf \n",list[local_18]->RSS,
           list[local_18 + -1]->RSS - list[local_18]->RSS,(ulong)(local_18 + 1),
           (ulong)(uint)list[local_18]->df_RSS,
           (ulong)(uint)(list[local_18 + -1]->df_RSS - list[local_18]->df_RSS));
  }
  return;
}

Assistant:

void anova_list(reg_object *list, int N) {
	int i;
	printf("\n");
	printf("ANOVA Multiple Models : \n");
	printf("%-10s%-25s%-20s%-20s%-20s \n","Model", "Res.Df", "RSS", "Df", "Sum of Sq");
	printf("%-10d%-25d%-20lf \n", 0,
		list[0]->df_RSS, list[0]->RSS);
	for(i = 1; i < N;++i) {
		printf("%-10d%-25d%-20lf%-20d%-20lf \n", i+1,
		list[i]->df_RSS, list[i]->RSS, list[i-1]->df_RSS-list[i]->df_RSS,list[i-1]->RSS-list[i]->RSS);
	}
}